

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O0

void __thiscall
duckdb::TupleDataCollection::InitializeScan
          (TupleDataCollection *this,TupleDataScanState *state,TupleDataPinProperties properties)

{
  idx_t __n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  vector<unsigned_long,_true> *in_RSI;
  TupleDataPinProperties in_stack_0000000f;
  vector<unsigned_long,_true> *in_stack_00000010;
  TupleDataScanState *in_stack_00000018;
  TupleDataCollection *in_stack_00000020;
  idx_t i;
  vector<unsigned_long,_true> column_ids;
  vector<unsigned_long,_true> *in_stack_ffffffffffffff68;
  value_type_conflict1 *in_stack_ffffffffffffff78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_48;
  
  vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x1647c97);
  __n = TupleDataLayout::ColumnCount((TupleDataLayout *)0x1647ca5);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (in_stack_ffffffffffffffa0,__n);
  local_48 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  while( true ) {
    this_00 = local_48;
    pvVar1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             TupleDataLayout::ColumnCount((TupleDataLayout *)0x1647cde);
    if (pvVar1 <= this_00) break;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (this_00,in_stack_ffffffffffffff78);
    local_48 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_48->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  vector<unsigned_long,_true>::vector(in_RSI,in_stack_ffffffffffffff68);
  InitializeScan(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000f);
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x1647d70);
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x1647d7a);
  return;
}

Assistant:

void TupleDataCollection::InitializeScan(TupleDataScanState &state, TupleDataPinProperties properties) const {
	vector<column_t> column_ids;
	column_ids.reserve(layout.ColumnCount());
	for (idx_t i = 0; i < layout.ColumnCount(); i++) {
		column_ids.push_back(i);
	}
	InitializeScan(state, std::move(column_ids), properties);
}